

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int nni_file_type(char *name,int *ftype)

{
  int iVar1;
  undefined8 in_RAX;
  int local_14 [2];
  int t;
  
  local_14[0] = (int)((ulong)in_RAX >> 0x20);
  iVar1 = nni_plat_file_type(name,local_14);
  if (iVar1 == 0) {
    iVar1 = (local_14[0] != 1) + 1;
    if (local_14[0] == 0) {
      iVar1 = 0;
    }
    *ftype = iVar1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nni_file_type(const char *name, int *ftype)
{
	int rv;
	int t;

	if ((rv = nni_plat_file_type(name, &t)) != 0) {
		return (rv);
	}

	switch (t) {
	case NNI_PLAT_FILE_TYPE_FILE:
		*ftype = NNI_FILE_TYPE_FILE;
		break;
	case NNI_PLAT_FILE_TYPE_DIR:
		*ftype = NNI_FILE_TYPE_DIR;
		break;
	default:
		*ftype = NNI_FILE_TYPE_OTHER;
		break;
	}
	return (0);
}